

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearTexData(ImFontAtlas *this)

{
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 0x30) != 0) {
    ImGui::MemFree(in_RDI);
  }
  if (*(long *)((long)in_RDI + 0x38) != 0) {
    ImGui::MemFree(in_RDI);
  }
  *(undefined8 *)((long)in_RDI + 0x30) = 0;
  *(undefined8 *)((long)in_RDI + 0x38) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  return;
}

Assistant:

void    ImFontAtlas::ClearTexData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    if (TexPixelsAlpha8)
        IM_FREE(TexPixelsAlpha8);
    if (TexPixelsRGBA32)
        IM_FREE(TexPixelsRGBA32);
    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
    TexPixelsUseColors = false;
    // Important: we leave TexReady untouched
}